

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void movd_PE(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Instruction).Category = 0x140001;
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      else {
        (pMyDisasm->Instruction).Category = 0x110001;
      }
      if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).REX.W_ != '\0'))
         && (((pMyDisasm->Reserved_).EVEX.state != '\x01' || ((pMyDisasm->Reserved_).EVEX.W != '\0')
             ))) {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vmovq");
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vmovd");
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    (pMyDisasm->Instruction).Category = 0x30001;
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        strcpy((pMyDisasm->Instruction).Mnemonic,"movq");
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"movd");
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
    }
    else {
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        strcpy((pMyDisasm->Instruction).Mnemonic,"movq");
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        strcpy((pMyDisasm->Instruction).Mnemonic,"movd");
      }
      (pMyDisasm->Reserved_).Register_ = 2;
      GxEx(pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ movd_PE(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION+DATA_TRANSFER;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
      }
      else {
        pMyDisasm->Instruction.Category = AVX_INSTRUCTION+DATA_TRANSFER;
      }
      if (
        ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
        ) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovd");
        #endif
        GV.MemDecoration = Arg2dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovq");
        #endif
        GV.MemDecoration = Arg2qword;
      }
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = MMX_INSTRUCTION+DATA_TRANSFER;
     /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      if (GV.REX.W_ == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
        GV.MemDecoration = Arg2qword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
        GV.MemDecoration = Arg2dword;
      }
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg2qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg2dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      GV.Register_ = MMX_REG;
      GxEx(pMyDisasm);
    }
  }
}